

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secure_erase.h
# Opt level: O2

void __thiscall
beast::detail::secure_erase_impl::impl::operator()(impl *this,void *dest,size_t bytes)

{
  long lVar1;
  bool bVar2;
  char *p;
  
  if (bytes != 0) {
    lVar1 = bytes - 1;
    p = (char *)dest;
    do {
      *p = '\0';
      bVar2 = lVar1 != 0;
      lVar1 = lVar1 + -1;
      if (*p != '\0') {
        return;
      }
      p = p + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void operator()(
            void* dest, std::size_t bytes) const override
        {
            char volatile* volatile p =
                const_cast<volatile char*>(
                    reinterpret_cast<char*>(dest));
            if (bytes == 0)
                return;
            do
            {
                *p = 0;
            }
            while(*p++ == 0 && --bytes);
        }